

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

bool iutest::internal::iuOperatorEQ<char[4],std::basic_string_view<char,std::char_traits<char>>>
               (char (*v1) [4],basic_string_view<char,_std::char_traits<char>_> *v2)

{
  bool bVar1;
  size_t sVar2;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  
  sVar2 = strlen(*v1);
  __x._M_str = *v1;
  __x._M_len = sVar2;
  bVar1 = std::operator==(__x,*v2);
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}